

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

int process_paths(vector<gdsPATH,_std::allocator<gdsPATH>_> *current_paths,
                 map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                 *poly_map_destination)

{
  uint *__x;
  size_type sVar1;
  mapped_type *this;
  pointer pgVar2;
  vector<co_ord,_std::allocator<co_ord>_> new_vector;
  co_ord temp_co;
  vector<co_ord,_std::allocator<co_ord>_> local_118;
  co_ord local_f8;
  pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_c0;
  gdsPATH local_a0;
  
  pgVar2 = (current_paths->super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_f8.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_f8.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_f8.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_f8.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  for (; pgVar2 != (current_paths->super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pgVar2 = pgVar2 + 1) {
    gdsPATH::gdsPATH(&local_a0,pgVar2);
    path_to_polygon(&local_a0,&local_f8);
    gdsPATH::~gdsPATH(&local_a0);
    __x = &pgVar2->layer;
    sVar1 = std::
            map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
            ::count(poly_map_destination,__x);
    if (sVar1 == 0) {
      local_118.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_118.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_118.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(&local_118,&local_f8);
      std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
      pair<unsigned_int_&,_std::vector<co_ord,_std::allocator<co_ord>_>_&,_true>
                (&local_c0,__x,&local_118);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
      ::_M_emplace_unique<std::pair<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
                  *)poly_map_destination,&local_c0);
      std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&local_c0.second);
      std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&local_118);
    }
    else {
      this = std::
             map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
             ::operator[](poly_map_destination,__x);
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(this,&local_f8);
    }
  }
  co_ord::~co_ord(&local_f8);
  return 0;
}

Assistant:

int process_paths(
    std::vector<gdsPATH> &current_paths,
    std::map<unsigned int, std::vector<co_ord>> &poly_map_destination)
{
  auto path_iter = current_paths.begin();
  co_ord temp_co;
  while (path_iter != current_paths.end()) {
    path_to_polygon(*path_iter, temp_co);
    if (poly_map_destination.count(path_iter->layer) > 0) // append
    {
      poly_map_destination[path_iter->layer].push_back(temp_co);
    } else {
      vector<co_ord> new_vector;
      new_vector.push_back(temp_co);
      poly_map_destination.insert(
          pair<unsigned int, vector<co_ord>>(path_iter->layer, new_vector));
    }
    path_iter++;
  }
  return EXIT_SUCCESS;
}